

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O1

int diag(char *fmt,...)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  char in_AL;
  char *__ptr;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  char *pcVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_108;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_108.reg_save_area = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_108.overflow_arg_area = &args[0].overflow_arg_area;
  local_108.gp_offset = 8;
  local_108.fp_offset = 0x30;
  if (fmt != (char *)0x0) {
    local_e0 = in_RSI;
    local_d8 = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    __ptr = vstrdupf(fmt,&local_108);
    cVar1 = *__ptr;
    pcVar3 = __ptr;
    pcVar4 = __ptr;
    while (cVar1 != '\0') {
      cVar1 = *pcVar3;
      bVar2 = true;
      if ((cVar1 == '\n') || (cVar1 == '\0')) {
        *pcVar3 = '\0';
        bVar2 = false;
        printf("# %s\n",pcVar4);
        if (cVar1 != '\0') {
          *pcVar3 = cVar1;
          bVar2 = true;
          pcVar4 = pcVar3 + 1;
        }
      }
      if (!bVar2) break;
      pcVar3 = pcVar3 + 1;
      cVar1 = *pcVar4;
    }
    free(__ptr);
  }
  return 0;
}

Assistant:

int
diag (const char *fmt, ...) {
    va_list args;
    char *mesg, *line;
    int i;
    va_start(args, fmt);
    if (!fmt) {
        va_end(args);
        return 0;
    }
    mesg = vstrdupf(fmt, args);
    line = mesg;
    for (i = 0; *line; i++) {
        char c = mesg[i];
        if (!c || c == '\n') {
            mesg[i] = '\0';
            printf("# %s\n", line);
            if (!c)
                break;
            mesg[i] = c;
            line = mesg + i + 1;
        }
    }
    free(mesg);
    va_end(args);
    return 0;
}